

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.hpp
# Opt level: O0

void __thiscall History::set_last_cmd(History *this,string *sess_id,string *cwd,string *cmd)

{
  socklen_t in_ECX;
  undefined4 in_register_0000000c;
  sockaddr *in_RDX;
  sockaddr *in_RSI;
  int in_EDI;
  Query query;
  undefined8 in_stack_ffffffffffffffc0;
  Database *in_stack_ffffffffffffffc8;
  Query *in_stack_ffffffffffffffd0;
  Query *this_00;
  
  this_00 = (Query *)CONCAT44(in_register_0000000c,in_ECX);
  sqlite::Query::Query
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(string *)in_stack_ffffffffffffffc0
            );
  sqlite::Query::bind((Query *)&stack0xffffffffffffffb0,in_EDI + 0x50,in_RSI,in_ECX);
  sqlite::Query::bind((Query *)&stack0xffffffffffffffb0,in_EDI + 0xe0,in_RDX,in_ECX);
  sqlite::Query::bind((Query *)&stack0xffffffffffffffb0,in_EDI + 0x170,(sockaddr *)this_00,in_ECX);
  sqlite::Query::exec(this_00);
  sqlite::Query::~Query((Query *)0x1bd29c);
  return;
}

Assistant:

void set_last_cmd(const std::string& sess_id, const std::string& cwd,
                    const std::string& cmd) {
    sqlite::Query query(db, lcSch.insertOrReplace);

    query.bind(lcSch.sess_id.bName,
               sess_id);  // TODO(dkolmakov): Implement type safe binding
    query.bind(lcSch.pwd.bName, cwd);
    query.bind(lcSch.cmd.bName, cmd);
    query.exec();
  }